

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::ReadNumericExpr
          (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *this,int opcode)

{
  undefined8 *in_RDI;
  double dVar1;
  SymbolicArgHandler args_4;
  int num_args_3;
  NumberOfArgHandler args_3;
  int num_args_2;
  NumericArgHandler args_2;
  int num_args_1;
  VarArgHandler args_1;
  int num_args;
  int i;
  PLTermHandler pl_handler;
  int num_slopes;
  NumericExpr else_expr;
  NumericExpr then_expr;
  LogicalExpr condition;
  BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::NumericExprReader>
  args;
  Kind kind;
  OpCodeInfo *info;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  TestNLHandler2 *pTVar2;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int iVar3;
  undefined8 in_stack_ffffffffffffff38;
  int num_args_00;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  TextReader<fmt::Locale> *in_stack_ffffffffffffff48;
  CStringRef in_stack_ffffffffffffff50;
  CStringRef arg0;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  Kind KVar4;
  BasicCStringRef<char> local_88 [2];
  int local_74;
  int local_68;
  int local_5c;
  int local_54;
  int local_48;
  PLTermHandler local_41;
  BasicCStringRef<char> local_40;
  int local_34;
  Kind local_1c;
  OpCodeInfo *local_18;
  
  num_args_00 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  iVar3 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_18 = GetOpCodeInfo(in_stack_ffffffffffffff34);
  KVar4 = local_18->kind;
  local_1c = KVar4;
  switch(local_18->first_kind) {
  case FIRST_UNARY:
    pTVar2 = (TestNLHandler2 *)in_RDI[2];
    ReadNumericExpr(in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
    TestNLHandler2::OnUnary(pTVar2,KVar4);
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef(local_88,"expected numeric expression opcode");
    TextReader<fmt::Locale>::ReportError<>(in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
    break;
  case ADD:
    BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::NumericExprReader>
    ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::NumericExprReader>
                       *)in_stack_ffffffffffffff20,
                      (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *)
                      CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    TestNLHandler2::OnBinary((TestNLHandler2 *)in_RDI[2],local_1c);
    break;
  case IF:
    ReadLogicalExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *)
                    CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    ReadNumericExpr(in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
    ReadNumericExpr(in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
    TestNLHandler2::OnIf((TestNLHandler2 *)in_RDI[2]);
    break;
  case PLTERM:
    local_34 = TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x2006ac);
    if (local_34 < 2) {
      arg0.data_ = (char *)*in_RDI;
      fmt::BasicCStringRef<char>::BasicCStringRef
                (&local_40,"too few slopes in piecewise-linear term");
      TextReader<fmt::Locale>::ReportError<>(in_stack_ffffffffffffff48,arg0);
    }
    TextReader<fmt::Locale>::ReadTillEndOfLine
              ((TextReader<fmt::Locale> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    TestNLHandler2::BeginPLTerm((TestNLHandler2 *)in_RDI[2],local_34 + -1);
    for (local_48 = 0; local_48 < local_34 + -1; local_48 = local_48 + 1) {
      dVar1 = ReadConstant(in_stack_ffffffffffffff20);
      TestNLHandler2::PLTermHandler::AddSlope(&local_41,dVar1);
      dVar1 = ReadConstant(in_stack_ffffffffffffff20);
      TestNLHandler2::PLTermHandler::AddBreakpoint(&local_41,dVar1);
    }
    dVar1 = ReadConstant(in_stack_ffffffffffffff20);
    TestNLHandler2::PLTermHandler::AddSlope(&local_41,dVar1);
    pTVar2 = (TestNLHandler2 *)in_RDI[2];
    ReadReference((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *)
                  CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    TestNLHandler2::EndPLTerm(pTVar2);
    break;
  case FIRST_ITERATED:
    local_54 = ReadNumArgs((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),iVar3);
    TestNLHandler2::BeginVarArg((TestNLHandler2 *)in_RDI[2],local_1c,local_54);
    NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
    ReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::NumericExprReader,TestNLHandler2::VarArgHandler>
              ((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),iVar3,
               (VarArgHandler *)in_stack_ffffffffffffff20);
    TestNLHandler2::EndVarArg((TestNLHandler2 *)in_RDI[2]);
    break;
  case SUM:
    local_5c = ReadNumArgs((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),iVar3);
    TestNLHandler2::BeginSum((TestNLHandler2 *)in_RDI[2],local_5c);
    NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
    ReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::NumericExprReader,TestNLHandler2::NumericArgHandler>
              ((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),iVar3,
               (NumericArgHandler *)in_stack_ffffffffffffff20);
    TestNLHandler2::EndSum((TestNLHandler2 *)in_RDI[2]);
    break;
  case LAST_ITERATED:
    local_68 = ReadNumArgs((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),iVar3);
    TextReader<fmt::Locale>::ReadTillEndOfLine
              ((TextReader<fmt::Locale> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    pTVar2 = (TestNLHandler2 *)in_RDI[2];
    iVar3 = local_68;
    ReadNumericExpr(in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
    TestNLHandler2::BeginNumberOf(pTVar2,iVar3);
    NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
    DoReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::NumericExprReader,TestNLHandler2::NumberOfArgHandler>
              ((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *)
               CONCAT44(iVar3,in_stack_ffffffffffffff40),(int)((ulong)pTVar2 >> 0x20),
               (NumberOfArgHandler *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    TestNLHandler2::EndNumberOf((TestNLHandler2 *)in_RDI[2]);
    break;
  case NUMBEROF_SYM:
    local_74 = ReadNumArgs((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),iVar3);
    TextReader<fmt::Locale>::ReadTillEndOfLine
              ((TextReader<fmt::Locale> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    pTVar2 = (TestNLHandler2 *)in_RDI[2];
    iVar3 = local_74;
    ReadSymbolicExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    TestNLHandler2::BeginSymbolicNumberOf(pTVar2,iVar3);
    NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
    DoReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::SymbolicExprReader,TestNLHandler2::SymbolicArgHandler>
              ((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),num_args_00,
               (SymbolicArgHandler *)CONCAT44(iVar3,in_stack_ffffffffffffff30));
    TestNLHandler2::EndSymbolicNumberOf((TestNLHandler2 *)in_RDI[2]);
    break;
  case COUNT:
    ReadCountExpr(in_stack_ffffffffffffff20);
  }
  return;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}